

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_predictor_8x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  __m128i ww [2];
  __m128i wh [8];
  __m128i pixels [8];
  int in_stack_000002f0;
  __m128i *in_stack_fffffffffffffeb8;
  __m128i *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  ptrdiff_t in_stack_ffffffffffffff40;
  uint8_t *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  __m128i *in_stack_ffffffffffffff58;
  __m128i *in_stack_ffffffffffffff60;
  __m128i *in_stack_ffffffffffffff68;
  
  load_pixel_w8(in_RDX,in_RCX,0x20,(__m128i *)&stack0xffffffffffffff58);
  load_weight_w8(in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  smooth_pred_8xh(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  in_stack_000002f0);
  smooth_pred_8xh(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  in_stack_000002f0);
  smooth_pred_8xh(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  in_stack_000002f0);
  smooth_pred_8xh(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  in_stack_000002f0);
  return;
}

Assistant:

void aom_smooth_predictor_8x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i pixels[8];
  load_pixel_w8(above, left, 32, pixels);

  __m128i wh[8], ww[2];
  load_weight_w8(32, wh, ww);

  smooth_pred_8xh(&pixels[0], wh, ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_8xh(&pixels[0], &wh[2], ww, 8, dst, stride, 1);
  dst += stride << 3;
  smooth_pred_8xh(&pixels[4], &wh[4], ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_8xh(&pixels[4], &wh[6], ww, 8, dst, stride, 1);
}